

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_TestParamSet_sub(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x17;
  uint64_t x16;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x15;
  uint64_t x14;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x13;
  uint64_t x12;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x11;
  uint64_t x10;
  uint64_t x9;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x8;
  uint64_t x7;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x6;
  uint64_t x5;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x4;
  uint64_t x3;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x2;
  uint64_t x1;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_99;
  uint64_t local_98;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_89;
  uint64_t in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  fiat_id_GostR3410_2001_TestParamSet_uint1 in_stack_ffffffffffffff87;
  undefined7 local_78;
  fiat_id_GostR3410_2001_TestParamSet_uint1 in_stack_ffffffffffffff8f;
  undefined7 in_stack_ffffffffffffff90;
  fiat_id_GostR3410_2001_TestParamSet_uint1 in_stack_ffffffffffffff97;
  uint64_t local_68;
  ulong local_60;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_51;
  uint64_t local_50;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_41;
  uint64_t local_40;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_31;
  uint64_t local_30;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_21;
  uint64_t local_20;
  uint64_t *local_18;
  uint64_t *local_10;
  uint64_t *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&local_20,&local_21,'\0',*in_RSI,*in_RDX);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64
            (&local_30,&local_31,local_21,local_10[1],local_18[1]);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64
            (&local_40,&local_41,local_31,local_10[2],local_18[2]);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64
            (&local_50,&local_51,local_41,local_10[3],local_18[3]);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff8f,CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)
             ,in_stack_ffffffffffffff78);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_68,&stack0xffffffffffffff97,'\0',local_20,local_60 & 0x431);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            ((uint64_t *)&local_78,&stack0xffffffffffffff87,in_stack_ffffffffffffff97,local_30,0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            ((uint64_t *)&stack0xffffffffffffff78,&local_89,in_stack_ffffffffffffff87,local_40,0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_98,&local_99,local_89,local_50,local_60 & 0x8000000000000000);
  *local_8 = local_68;
  local_8[1] = CONCAT17(in_stack_ffffffffffffff8f,local_78);
  local_8[2] = in_stack_ffffffffffffff78;
  local_8[3] = local_98;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_sub(uint64_t out1[4],
                                                    const uint64_t arg1[4],
                                                    const uint64_t arg2[4]) {
    uint64_t x1;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x2;
    uint64_t x3;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x4;
    uint64_t x5;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x6;
    uint64_t x7;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x8;
    uint64_t x9;
    uint64_t x10;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x11;
    uint64_t x12;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x13;
    uint64_t x14;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x15;
    uint64_t x16;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x17;
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x1, &x2, 0x0, (arg1[0]),
                                                       (arg2[0]));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x3, &x4, x2, (arg1[1]),
                                                       (arg2[1]));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x5, &x6, x4, (arg1[2]),
                                                       (arg2[2]));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x7, &x8, x6, (arg1[3]),
                                                       (arg2[3]));
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(
        &x9, x8, 0x0, UINT64_C(0xffffffffffffffff));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x10, &x11, 0x0, x1,
                                                      (x9 & UINT16_C(0x431)));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x12, &x13, x11, x3, 0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x14, &x15, x13, x5, 0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(
        &x16, &x17, x15, x7, (x9 & UINT64_C(0x8000000000000000)));
    out1[0] = x10;
    out1[1] = x12;
    out1[2] = x14;
    out1[3] = x16;
}